

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_revision.cpp
# Opt level: O3

void __thiscall RevisionsFixture_InitNothing_Test::TestBody(RevisionsFixture_InitNothing_Test *this)

{
  type *ptVar1;
  char *message;
  revisions_type actual;
  revisions_type expected;
  AssertHelper AStack_58;
  Message local_50;
  undefined1 local_48 [4];
  type local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  revisions_type local_38;
  pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_> local_2c;
  
  local_48[0] = (internal)0x1;
  local_44 = (type)0x7;
  local_2c.first = 8;
  ptVar1 = (type *)pstore::maybe<unsigned_int,_void>::operator->
                             ((maybe<unsigned_int,_void> *)local_48);
  local_2c.second.storage_ = *ptVar1;
  local_2c.second.valid_ = true;
  local_48 = (undefined1  [4])0xffffffff;
  local_44.__data = local_44.__data & 0xffffff00;
  pstore::diff_dump::update_revisions(&local_38,(revisions_type *)local_48,8);
  testing::internal::
  CmpHelperEQ<std::pair<unsigned_int,pstore::maybe<unsigned_int,void>>,std::pair<unsigned_int,pstore::maybe<unsigned_int,void>>>
            ((internal *)local_48,"expected","actual",&local_2c,&local_38);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/diff/test_revision.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&AStack_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if (local_50.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_50.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_F (RevisionsFixture, InitNothing) {
    diff_dump::revisions_type const expected =
        this->expected_revisions (db_head_revision, db_head_revision - 1);
    diff_dump::revisions_type const actual = diff_dump::update_revisions (
        std::make_pair (head_revision, nothing<revision_number> ()), db_head_revision);

    EXPECT_EQ (expected, actual);
}